

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O0

void BinarySource_REWIND_TO__(BinarySource *src,size_t pos)

{
  size_t pos_local;
  BinarySource *src_local;
  
  if (src->len < pos) {
    src->pos = src->len;
    src->err = BSE_OUT_OF_DATA;
  }
  else {
    src->pos = pos;
    src->err = BSE_NO_ERROR;
  }
  return;
}

Assistant:

void BinarySource_REWIND_TO__(BinarySource *src, size_t pos)
{
    if (pos <= src->len) {
        src->pos = pos;
        src->err = BSE_NO_ERROR;    /* clear any existing error */
    } else {
        src->pos = src->len;
        src->err = BSE_OUT_OF_DATA; /* new error if we rewind out of range */
    }
}